

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_write_multiple_bufs(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar4;
  undefined8 uVar5;
  __off64_t _Var6;
  void *pvVar7;
  void *pvVar8;
  char *pcVar9;
  int in_EDI;
  long unaff_R12;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  uv_buf_t uVar15;
  undefined1 auStack_da [2];
  code *pcStack_d8;
  undefined8 uStack_d0;
  long lStack_c0;
  void *pvStack_b8;
  long lStack_b0;
  undefined1 auStack_40 [16];
  undefined1 auStack_30 [16];
  undefined8 uStack_18;
  
  fs_write_multiple_bufs(in_EDI);
  fs_write_multiple_bufs(in_EDI);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_18 = uVar4;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar3 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar3 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00161abc:
    fs_write_multiple_bufs_cold_2();
LAB_00161ac1:
    fs_write_multiple_bufs_cold_3();
LAB_00161ac6:
    fs_write_multiple_bufs_cold_4();
LAB_00161acb:
    fs_write_multiple_bufs_cold_5();
LAB_00161ad0:
    fs_write_multiple_bufs_cold_6();
LAB_00161ad5:
    fs_write_multiple_bufs_cold_7();
LAB_00161ada:
    fs_write_multiple_bufs_cold_8();
LAB_00161adf:
    fs_write_multiple_bufs_cold_9();
LAB_00161ae4:
    fs_write_multiple_bufs_cold_10();
LAB_00161ae9:
    fs_write_multiple_bufs_cold_11();
LAB_00161aee:
    fs_write_multiple_bufs_cold_12();
LAB_00161af3:
    fs_write_multiple_bufs_cold_13();
LAB_00161af8:
    fs_write_multiple_bufs_cold_14();
LAB_00161afd:
    fs_write_multiple_bufs_cold_15();
LAB_00161b02:
    fs_write_multiple_bufs_cold_16();
LAB_00161b07:
    fs_write_multiple_bufs_cold_19();
LAB_00161b0c:
    fs_write_multiple_bufs_cold_20();
LAB_00161b11:
    fs_write_multiple_bufs_cold_21();
LAB_00161b16:
    fs_write_multiple_bufs_cold_22();
LAB_00161b1b:
    fs_write_multiple_bufs_cold_23();
LAB_00161b20:
    fs_write_multiple_bufs_cold_24();
LAB_00161b25:
    fs_write_multiple_bufs_cold_25();
LAB_00161b2a:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00161abc;
    uv_fs_req_cleanup(&open_req1);
    auStack_40 = uv_buf_init(test_buf,0xd);
    auStack_30 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_40,2,0);
    if (iVar3 < 0) goto LAB_00161ac1;
    if (write_req.result < 0) goto LAB_00161ac6;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00161acb;
    if (close_req.result != 0) goto LAB_00161ad0;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_00161ad5;
    if (open_req1.result._4_4_ < 0) goto LAB_00161ada;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar14 = uv_buf_init(buf,0xd);
    auStack_40 = auVar14;
    auVar14 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_30 = auVar14;
    _Var6 = lseek64((int)open_req1.result,0,1);
    if (_Var6 != 0) goto LAB_00161adf;
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_40,2,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00161ae4;
    if (read_req.result != 0x1c) goto LAB_00161ae9;
    iVar2 = 0x2f84e0;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00161aee;
    iVar2 = 0x2fa4d0;
    iVar3 = strcmp(buf2,test_buf2);
    if (iVar3 != 0) goto LAB_00161af3;
    uv_fs_req_cleanup(&read_req);
    iov = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_00161af8;
    if (read_req.result != 0) goto LAB_00161afd;
    uv_fs_req_cleanup(&read_req);
    auVar14 = uv_buf_init(buf,0xd);
    auStack_40 = auVar14;
    auVar14 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_30 = auVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_40,2,0);
    if (iVar3 < 0) goto LAB_00161b02;
    if (read_req.result == 0x1c) {
LAB_001619ba:
      iVar2 = 0x2f84e0;
      iVar3 = strcmp(buf,test_buf);
      if (iVar3 != 0) goto LAB_00161b07;
      iVar2 = 0x2fa4d0;
      iVar3 = strcmp(buf2,test_buf2);
      if (iVar3 != 0) goto LAB_00161b0c;
      uv_fs_req_cleanup(&read_req);
      uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar15;
      iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar3 != 0) goto LAB_00161b11;
      if (read_req.result != 0) goto LAB_00161b16;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar3 != 0) goto LAB_00161b1b;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_00161b20;
    }
    if (read_req.result != 0xd) goto LAB_00161b25;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_30,1,read_req.result);
    if (iVar3 < 0) goto LAB_00161b2a;
    if (read_req.result == 0xf) goto LAB_001619ba;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar7 = malloc(0xd4310);
  if (pvVar7 == (void *)0x0) {
LAB_00161eb1:
    fs_write_alotof_bufs_cold_18();
LAB_00161eb6:
    fs_write_alotof_bufs_cold_1();
LAB_00161ebb:
    fs_write_alotof_bufs_cold_2();
LAB_00161ec0:
    fs_write_alotof_bufs_cold_3();
LAB_00161ec5:
    fs_write_alotof_bufs_cold_4();
LAB_00161eca:
    fs_write_alotof_bufs_cold_17();
LAB_00161ecf:
    fs_write_alotof_bufs_cold_5();
LAB_00161ed4:
    fs_write_alotof_bufs_cold_6();
LAB_00161ed9:
    fs_write_alotof_bufs_cold_7();
LAB_00161ede:
    fs_write_alotof_bufs_cold_8();
LAB_00161ee3:
    fs_write_alotof_bufs_cold_9();
LAB_00161ee8:
    fs_write_alotof_bufs_cold_10();
LAB_00161eed:
    fs_write_alotof_bufs_cold_12();
LAB_00161ef2:
    fs_write_alotof_bufs_cold_13();
LAB_00161ef7:
    fs_write_alotof_bufs_cold_14();
LAB_00161efc:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00161eb6;
    if (open_req1.result._4_4_ < 0) goto LAB_00161ebb;
    uv_fs_req_cleanup(&open_req1);
    lVar12 = 8;
    do {
      auVar14 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar7 + lVar12 + -8) = auVar14._0_8_;
      *(long *)((long)pvVar7 + lVar12) = auVar14._8_8_;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00161ec0;
    if (write_req.result != 0xac67d) goto LAB_00161ec5;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar8 = malloc(0xac67d);
    if (pvVar8 == (void *)0x0) goto LAB_00161eca;
    lVar12 = 8;
    pvVar13 = pvVar8;
    do {
      auVar14 = uv_buf_init(pvVar13,0xd);
      *(long *)((long)pvVar7 + lVar12 + -8) = auVar14._0_8_;
      *(long *)((long)pvVar7 + lVar12) = auVar14._8_8_;
      lVar12 = lVar12 + 0x10;
      pvVar13 = (void *)((long)pvVar13 + 0xd);
    } while (lVar12 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar3 != 0) goto LAB_00161ecf;
    if (close_req.result != 0) goto LAB_00161ed4;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_00161ed9;
    if (open_req1.result._4_4_ < 0) goto LAB_00161ede;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00161ee3;
    if (read_req.result != 0x3400) goto LAB_00161ee8;
    unaff_R12 = 0;
    do {
      pcVar9 = (char *)((long)pvVar8 + unaff_R12);
      iVar3 = strncmp(pcVar9,test_buf,0xd);
      iVar2 = (int)pcVar9;
      if (iVar3 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00161eb1;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar8);
    iVar2 = (int)open_req1.result;
    _Var6 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00161eed;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_00161ef2;
    if (read_req.result != 0) goto LAB_00161ef7;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00161efc;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar7);
      return extraout_EAX;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar7 = (void *)uv_default_loop();
  uv_walk(pvVar7,close_walk_cb,0);
  uv_run(pvVar7,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_d8 = (code *)0x161f6d;
  pvStack_b8 = pvVar7;
  lStack_b0 = unaff_R12;
  unlink("test_file");
  pcStack_d8 = (code *)0x161f72;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_d8 = (code *)0x161f83;
  pvVar8 = malloc(0xd4310);
  if (pvVar8 == (void *)0x0) {
LAB_001622cf:
    pvVar8 = pvVar7;
    pcStack_d8 = (code *)0x1622d4;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_001622d4:
    pcStack_d8 = (code *)0x1622d9;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_001622d9:
    pcStack_d8 = (code *)0x1622de;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_001622de:
    pcStack_d8 = (code *)0x1622e3;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_001622e3:
    pcStack_d8 = (code *)0x1622e8;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_001622e8:
    pcStack_d8 = (code *)0x1622ed;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_001622ed:
    pcStack_d8 = (code *)0x1622f2;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_001622f2:
    pcStack_d8 = (code *)0x1622f7;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_001622f7:
    pcStack_d8 = (code *)0x1622fc;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_001622fc:
    pcStack_d8 = (code *)0x162301;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00162301:
    pcStack_d8 = (code *)0x162306;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00162306:
    pcStack_d8 = (code *)0x16230b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0016230b:
    pcStack_d8 = (code *)0x162310;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00162310:
    pcStack_d8 = (code *)0x162315;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00162315:
    pcStack_d8 = (code *)0x16231a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_d8 = (code *)0x161fb2;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_001622d4;
    if (open_req1.result._4_4_ < 0) goto LAB_001622d9;
    pcStack_d8 = (code *)0x161fd4;
    uv_fs_req_cleanup(&open_req1);
    pcStack_d8 = (code *)0x161fe5;
    uVar15 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_d0 = 0;
    pcStack_d8 = (code *)0x162023;
    iov = uVar15;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_001622de;
    if (write_req.result != 10) goto LAB_001622e3;
    pcStack_d8 = (code *)0x162048;
    uv_fs_req_cleanup(&write_req);
    lVar12 = 8;
    do {
      pcStack_d8 = (code *)0x162062;
      auVar14 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar8 + lVar12 + -8) = auVar14._0_8_;
      *(long *)((long)pvVar8 + lVar12) = auVar14._8_8_;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0xd4318);
    uStack_d0 = 0;
    pcStack_d8 = (code *)0x1620a3;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_001622e8;
    if (write_req.result != 0xac67d) goto LAB_001622ed;
    pcStack_d8 = (code *)0x1620c8;
    uv_fs_req_cleanup(&write_req);
    pcStack_d8 = (code *)0x1620d2;
    pcVar9 = (char *)malloc(0xac67d);
    if (pcVar9 == (char *)0x0) goto LAB_001622f2;
    lVar12 = 8;
    pcVar10 = pcVar9;
    do {
      pcStack_d8 = (code *)0x1620f4;
      auVar14 = uv_buf_init(pcVar10,0xd);
      *(long *)((long)pvVar8 + lVar12 + -8) = auVar14._0_8_;
      *(long *)((long)pvVar8 + lVar12) = auVar14._8_8_;
      lVar12 = lVar12 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar12 != 0xd4318);
    uStack_d0 = 0;
    pcStack_d8 = (code *)0x162136;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_001622f7;
    lStack_c0 = 10;
    lVar12 = 0xd;
    if (iVar2 != 0xd) {
      lVar12 = 0x3400;
    }
    if (read_req.result != lVar12) goto LAB_001622fc;
    pcVar10 = pcVar9;
    uVar11 = 0;
    do {
      pcStack_d8 = (code *)0x162180;
      iVar3 = strncmp(pcVar10,test_buf,0xd);
      if (iVar3 != 0) {
        pcStack_d8 = (code *)0x1622cf;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar7 = pvVar8;
        goto LAB_001622cf;
      }
      if (iVar2 == 0xd) break;
      pcVar10 = pcVar10 + 0xd;
      bVar1 = uVar11 < 0x3ff;
      uVar11 = uVar11 + 1;
    } while (bVar1);
    pcStack_d8 = (code *)0x1621ad;
    uv_fs_req_cleanup(&read_req);
    pcStack_d8 = (code *)0x1621b5;
    free(pcVar9);
    pcStack_d8 = (code *)0x1621cc;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar12 = lStack_c0;
    if (iVar2 != 0) goto LAB_00162301;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + lStack_c0) goto LAB_00162306;
    pcStack_d8 = (code *)0x162200;
    uv_fs_req_cleanup(&stat_req);
    pcStack_d8 = (code *)0x162211;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_d0 = 0;
    pcStack_d8 = (code *)0x162252;
    iov = uVar15;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,lVar12 + write_req.result);
    if (iVar2 != 0) goto LAB_0016230b;
    if (read_req.result != 0) goto LAB_00162310;
    pcStack_d8 = (code *)0x162274;
    uv_fs_req_cleanup(&read_req);
    pcStack_d8 = (code *)0x16228a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00162315;
    if (close_req.result == 0) {
      pcStack_d8 = (code *)0x1622a8;
      uv_fs_req_cleanup(&close_req);
      pcStack_d8 = (code *)0x1622b4;
      unlink("test_file");
      free(pvVar8);
      return extraout_EAX_00;
    }
  }
  pcStack_d8 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_d8 = (code *)pvVar8;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00162496;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_0016249b;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = (uv_buf_t)uv_buf_init(auStack_da,2);
    iov = uVar15;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_001624a0;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001624aa;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00162496:
    run_test_fs_read_dir_cold_2();
LAB_0016249b:
    run_test_fs_read_dir_cold_3();
LAB_001624a0:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001624aa:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_write_multiple_bufs) {
  fs_write_multiple_bufs(0);
  fs_write_multiple_bufs(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}